

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_interface.cpp
# Opt level: O3

mt32emu_return_code
mt32emu_merge_and_add_rom_data
          (mt32emu_context context,mt32emu_bit8u *part1_data,size_t part1_data_size,
          mt32emu_sha1_digest *part1_sha1_digest,mt32emu_bit8u *part2_data,size_t part2_data_size,
          mt32emu_sha1_digest *part2_sha1_digest)

{
  mt32emu_return_code mVar1;
  ArrayFile *this;
  ArrayFile *this_00;
  
  this = (ArrayFile *)operator_new(0x50);
  if (part1_sha1_digest == (mt32emu_sha1_digest *)0x0) {
    MT32Emu::ArrayFile::ArrayFile(this,part1_data,part1_data_size);
  }
  else {
    MT32Emu::ArrayFile::ArrayFile(this,part1_data,part1_data_size,part1_sha1_digest);
  }
  this_00 = (ArrayFile *)operator_new(0x50);
  if (part2_sha1_digest == (mt32emu_sha1_digest *)0x0) {
    MT32Emu::ArrayFile::ArrayFile(this_00,part2_data,part2_data_size);
  }
  else {
    MT32Emu::ArrayFile::ArrayFile(this_00,part2_data,part2_data_size,part2_sha1_digest);
  }
  mVar1 = MT32Emu::addROMFiles(context,(File *)this,(File *)this_00,(MachineConfiguration *)0x0);
  (*(this->super_AbstractFile).super_File._vptr_File[1])(this);
  (*(this_00->super_AbstractFile).super_File._vptr_File[1])(this_00);
  return mVar1;
}

Assistant:

mt32emu_return_code MT32EMU_C_CALL mt32emu_merge_and_add_rom_data(mt32emu_context context, const mt32emu_bit8u *part1_data, size_t part1_data_size, const mt32emu_sha1_digest *part1_sha1_digest, const mt32emu_bit8u *part2_data, size_t part2_data_size, const mt32emu_sha1_digest *part2_sha1_digest) {
	ArrayFile *file1 = part1_sha1_digest == NULL ? new ArrayFile(part1_data, part1_data_size) : new ArrayFile(part1_data, part1_data_size, *part1_sha1_digest);
	ArrayFile *file2 = part2_sha1_digest == NULL ? new ArrayFile(part2_data, part2_data_size) : new ArrayFile(part2_data, part2_data_size, *part2_sha1_digest);
	mt32emu_return_code rc = addROMFiles(context, file1, file2);
	delete file1;
	delete file2;
	return rc;
}